

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

int main(void)

{
  Exception *ex;
  function<void_()> local_470;
  undefined1 local_440 [8];
  Timer timer;
  Loop loop;
  
  uv::Timer::Timer((Timer *)local_440);
  uv::Loop::init((Loop *)&timer.startHandler_._M_invoker,(EVP_PKEY_CTX *)0x0);
  uv::Timer::init((Timer *)local_440,(EVP_PKEY_CTX *)&timer.startHandler_._M_invoker);
  std::function<void()>::function<main::__0,void>
            ((function<void()> *)&local_470,(anon_class_1_0_00000001 *)((long)&ex + 7));
  uv::Timer::start((Timer *)local_440,&local_470,1000,1000);
  std::function<void_()>::~function(&local_470);
  uv::Loop::run((Loop *)&timer.startHandler_._M_invoker);
  uv::Timer::~Timer((Timer *)local_440);
  uv::Loop::~Loop((Loop *)&timer.startHandler_._M_invoker);
  return 0;
}

Assistant:

int main()
{
	uv::Loop loop;
	uv::Timer timer;

	try {
		loop.init();
		timer.init(loop);

		timer.start([]() {
			std::cout << "Hello,World" << std::endl;
		}, 1000, 1000);

		loop.run();
	}
	catch (const uv::Exception &ex) {
		std::cout << ex.what() << std::endl;
	}
}